

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcodeinject.hh
# Opt level: O0

ExecutablePcode * __thiscall ExecutablePcode::getSource_abi_cxx11_(ExecutablePcode *this)

{
  long in_RSI;
  ExecutablePcode *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x70));
  return this;
}

Assistant:

virtual string getSource(void) const { return source; }